

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sgen4.c
# Opt level: O0

void printClauseArray(void)

{
  Clause *c;
  int *clauseOrder;
  int i;
  undefined8 in_stack_fffffffffffffff0;
  int numOfElements;
  int local_4;
  
  numOfElements = (int)((ulong)in_stack_fffffffffffffff0 >> 0x20);
  if (booleanOptions[2] == 0) {
    c = (Clause *)getIdentityFromZero(numOfElements);
  }
  else {
    c = (Clause *)getRandomFromZero(numOfElements);
  }
  for (local_4 = 0; local_4 < clauses; local_4 = local_4 + 1) {
    printClause(c);
  }
  free(c);
  return;
}

Assistant:

void printClauseArray()
{
    int i;

    int *clauseOrder;

    if (booleanOptions[REORDER])
        clauseOrder = getRandomFromZero (clauses);
    else
        clauseOrder = getIdentityFromZero (clauses);

    for (i=0;i<clauses;i++)
        printClause (&clauseArray[clauseOrder[i]]);

    free (clauseOrder);
}